

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O1

void cppwinrt::write_forward(writer *w,TypeDef *type)

{
  long lVar1;
  uint uVar2;
  size_t __n;
  char *__s1;
  bool bVar3;
  category cVar4;
  int iVar5;
  ulong uVar6;
  size_type __rlen;
  type_name type_name;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> generics;
  type_name local_128;
  anon_class_8_1_89897ddb_conflict2 local_108;
  undefined1 local_100 [40];
  char *local_d8;
  FieldSig local_d0;
  
  cppwinrt::type_name::type_name(&local_128,type);
  cVar4 = winmd::reader::get_category(type);
  if (cVar4 == enum_type) {
    local_100._32_8_ = 0x16;
    local_d8 = "    enum class % : %;\n";
    winmd::reader::row_base<winmd::reader::TypeDef>::get_list<winmd::reader::Field>
              ((pair<winmd::reader::Field,_winmd::reader::Field> *)local_100,
               &type->super_row_base<winmd::reader::TypeDef>,4);
    winmd::reader::Field::Signature(&local_d0,(Field *)local_100);
    writer_base<cppwinrt::writer>::
    write_segment<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeSig>
              (&w->super_writer_base<cppwinrt::writer>,(string_view *)(local_100 + 0x20),
               &local_128.name,(TypeSig *)((long)&local_d0 + 0x20));
    if (local_d0.m_type.m_array_sizes.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.m_type.m_array_sizes.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.m_type.m_array_sizes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.m_type.m_array_sizes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__detail::__variant::
    _Variant_storage<false,_winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
    ::~_Variant_storage((_Variant_storage<false,_winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                         *)&local_d0.m_type.m_type);
    if (local_d0.m_type.m_cmod.
        super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.m_type.m_cmod.
                      super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d0.m_type.m_cmod.
                            super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.m_type.m_cmod.
                            super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d0.m_cmod.
        super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      return;
    }
    operator_delete(local_d0.m_cmod.
                    super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(local_d0.m_cmod.
                             super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             (uint32_t)
                             local_d0.m_cmod.
                             super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage) -
                    (long)local_d0.m_cmod.
                          super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    return;
  }
  local_d0._0_8_ = (table_base *)0x1b;
  local_d0.m_cmod.
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x17a3ed;
  bVar3 = operator==(&local_128,(string_view *)&local_d0);
  if (bVar3) {
    return;
  }
  local_100._0_8_ = (database *)0x1b;
  local_100._8_8_ = "Windows.Foundation.TimeSpan";
  bVar3 = operator==(&local_128,(string_view *)local_100);
  if (bVar3) {
    return;
  }
  if ((local_128.name_space._M_len != 0x1b) ||
     (iVar5 = bcmp(local_128.name_space._M_str,"Windows.Foundation.Numerics",0x1b),
     __s1 = local_128.name._M_str, __n = local_128.name._M_len, iVar5 != 0))
  goto switchD_00116e69_caseD_1;
  lVar1 = local_128.name._M_len - 5;
  switch(lVar1) {
  case 0:
switchD_00116e69_caseD_0:
    iVar5 = bcmp(__s1,"Plane",__n);
    if (iVar5 == 0) {
      return;
    }
    if (__n != 7) {
      if (__n != 10) goto switchD_00116e69_caseD_1;
      goto switchD_00116e69_caseD_5;
    }
    break;
  default:
    goto switchD_00116e69_caseD_1;
  case 2:
    break;
  case 4:
    iVar5 = bcmp(local_128.name._M_str,"Matrix3x2",local_128.name._M_len);
    if (iVar5 == 0) {
      return;
    }
    switch(lVar1) {
    case 0:
      goto switchD_00116e69_caseD_0;
    default:
      goto switchD_00116e69_caseD_1;
    case 2:
      break;
    case 4:
      iVar5 = bcmp(__s1,"Matrix4x4",__n);
      if (iVar5 == 0) {
        return;
      }
      if (__n == 10) goto switchD_00116e69_caseD_5;
      if (__n != 7) {
        if (__n != 5) goto switchD_00116e69_caseD_1;
        goto switchD_00116e69_caseD_0;
      }
      break;
    case 5:
      goto switchD_00116e69_caseD_5;
    }
    break;
  case 5:
switchD_00116e69_caseD_5:
    iVar5 = bcmp(__s1,"Quaternion",__n);
    if (iVar5 == 0) {
      return;
    }
    if (__n != 7) goto switchD_00116e69_caseD_1;
  }
  iVar5 = bcmp(__s1,"Vector2",__n);
  if (iVar5 == 0) {
    return;
  }
  if (__n == 7) {
    iVar5 = bcmp(__s1,"Vector3",7);
    if (iVar5 == 0) {
      return;
    }
    iVar5 = bcmp(__s1,"Vector4",7);
    if (iVar5 == 0) {
      return;
    }
  }
switchD_00116e69_caseD_1:
  local_100._0_8_ = (type->super_row_base<winmd::reader::TypeDef>).m_table;
  uVar2 = (type->super_row_base<winmd::reader::TypeDef>).m_index * 2 + 2;
  local_100._8_4_ = uVar2;
  winmd::reader::
  equal_range<winmd::reader::table<winmd::reader::GenericParam>,winmd::reader::coded_index<winmd::reader::TypeOrMethodDef>>
            ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&local_d0,
             (reader *)
             &((((database *)local_100._0_8_)->TypeRef).super_table_base.m_database)->GenericParam,
             (table<winmd::reader::GenericParam> *)local_100,
             (coded_index<winmd::reader::TypeOrMethodDef> *)(ulong)uVar2);
  if (((pointer)local_d0._0_8_ ==
       local_d0.m_cmod.
       super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((uint32_t)
      local_d0.m_cmod.
      super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (uint32_t)
      local_d0.m_cmod.
      super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage)) {
    local_100._0_8_ = (database *)0xe;
    local_100._8_8_ = "    struct %;\n";
    writer_base<cppwinrt::writer>::
    write_segment<std::basic_string_view<char,std::char_traits<char>>>
              (&w->super_writer_base<cppwinrt::writer>,(string_view *)local_100,&local_128.name);
  }
  else {
    local_100._0_8_ = (database *)0x32;
    local_100._8_8_ = "    template <%> struct WINRT_IMPL_EMPTY_BASES %;\n";
    uVar6 = local_128.name._M_len;
    if (local_128.name._M_len == 0) {
LAB_00116e02:
      local_100._32_8_ = 0xffffffffffffffff;
    }
    else {
      do {
        local_100._32_8_ = uVar6 - 1;
        if (uVar6 == 0) goto LAB_00116e02;
        lVar1 = uVar6 - 1;
        uVar6 = local_100._32_8_;
      } while (local_128.name._M_str[lVar1] != '`');
    }
    if (local_128.name._M_len < (ulong)local_100._32_8_) {
      local_100._32_8_ = local_128.name._M_len;
    }
    local_d8 = local_128.name._M_str;
    local_108.args = (pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&local_d0;
    writer_base<cppwinrt::writer>::
    write_segment<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>_>
              (&w->super_writer_base<cppwinrt::writer>,(string_view *)local_100,&local_108,
               (basic_string_view<char,_std::char_traits<char>_> *)(local_100 + 0x20));
  }
  return;
}

Assistant:

static void write_forward(writer& w, TypeDef const& type)
    {
        type_name type_name(type);

        if (get_category(type) == category::enum_type)
        {
            auto format = R"(    enum class % : %;
)";

            w.write(format, type_name.name, type.FieldList().first.Signature().Type());
            return;
        }

        if (type_name == "Windows.Foundation.DateTime" ||
            type_name == "Windows.Foundation.TimeSpan")
        {
            // Don't forward declare these since they're not structs.
            return;
        }

        if (type_name.name_space == "Windows.Foundation.Numerics")
        {
            if (type_name.name == "Matrix3x2" ||
                type_name.name == "Matrix4x4" ||
                type_name.name == "Plane" ||
                type_name.name == "Quaternion" ||
                type_name.name == "Vector2" ||
                type_name.name == "Vector3" ||
                type_name.name == "Vector4")
            {
                // Don't forward declare these since they're already defined with different names.
                return;
            }
        }

        auto generics = type.GenericParam();

        if (empty(generics))
        {
            auto format = R"(    struct %;
)";

            w.write(format, type_name.name);
            return;
        }

        auto format = R"(    template <%> struct WINRT_IMPL_EMPTY_BASES %;
)";

        w.write(format,
            bind<write_generic_typenames>(generics),
            remove_tick(type_name.name));
    }